

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O2

void __thiscall
TopologicalSortTest_TwoChains_Test::TestBody(TopologicalSortTest_TwoChains_Test *this)

{
  size_t *__a;
  long lVar1;
  char *message;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_05;
  TopologicalOrdersImpl<std::monostate> local_2f8;
  TopologicalOrdersImpl<std::monostate> local_288;
  undefined1 local_218 [8];
  TopologicalOrders orders;
  uint local_198 [2];
  undefined1 *puStack_190;
  uint local_188 [10];
  undefined1 local_160 [8];
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  results;
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  expected;
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined1 local_70 [8];
  Graph_conflict graph;
  AssertHelper local_48;
  undefined8 uStack_40;
  allocator_type local_30;
  allocator_type local_2f;
  allocator_type local_2e;
  allocator_type local_2d;
  allocator_type local_2c;
  allocator_type local_2b;
  less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_2a;
  allocator_type local_29;
  
  __a = &expected._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_70,4,(allocator_type *)__a);
  expected._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
             (uint *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  expected._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_70 + 0x18),
             (uint *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_218,local_70);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl(&local_2f8,local_218);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            (&local_288,(TopologicalOrdersImpl<std::monostate> *)local_218);
  std::
  set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::set<wasm::TopologicalOrdersImpl<std::monostate>>
            ((set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)local_160,&local_2f8,&local_288);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_288);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_2f8);
  graph.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_100000000;
  __l._M_len = 4;
  __l._M_array = (iterator)
                 &graph.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a,__l,&local_30);
  local_48.data_ = (AssertHelperData *)&DAT_100000000;
  uStack_40 = 0x200000003;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e8,__l_00,&local_2f);
  orders.selectors.
  super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_200000000;
  __l_01._M_len = 4;
  __l_01._M_array =
       (iterator)
       &orders.selectors.
        super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,__l_01,&local_2e);
  local_198[0] = 1;
  local_198[1] = 0;
  puStack_190 = &DAT_300000002;
  __l_02._M_len = 4;
  __l_02._M_array = local_198;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,__l_02,&local_2d);
  local_188[0] = 1;
  local_188[1] = 0;
  local_188[2] = 3;
  local_188[3] = 2;
  __l_03._M_len = 4;
  __l_03._M_array = local_188;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a0,__l_03,&local_2c);
  local_188[4] = 1;
  local_188[5] = 3;
  local_188[6] = 0;
  local_188[7] = 2;
  __l_04._M_len = 4;
  __l_04._M_array = local_188 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,__l_04,&local_2b);
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)&results._M_t._M_impl.super__Rb_tree_header._M_node_count,__l_05,&local_2a,&local_29);
  lVar1 = 0x78;
  do {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  testing::internal::
  CmpHelperEQ<std::set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
            ((internal *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count,"results",
             "expected",
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_160,
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((char)expected._M_t._M_impl.super__Rb_tree_header._M_node_count == '\0') {
    testing::Message::Message
              ((Message *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=
              (&local_48,
               (Message *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (graph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(((graph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start + 2))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_160);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_218);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_70);
  return;
}

Assistant:

TEST(TopologicalSortTest, TwoChains) {
  Graph graph(4);
  graph[0].push_back(2);
  graph[1].push_back(3);
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{
    {0, 1, 2, 3},
    {0, 1, 3, 2},
    {0, 2, 1, 3},
    {1, 0, 2, 3},
    {1, 0, 3, 2},
    {1, 3, 0, 2},
  };
  EXPECT_EQ(results, expected);
}